

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool _missingAssertions;
  uint uVar10;
  SectionInfo testCaseSection;
  Counts assertions;
  SectionStats testCaseSectionStats;
  string local_468;
  SectionInfo local_448;
  undefined1 local_3f8 [408];
  undefined1 local_260 [48];
  _Alloc_hider local_230;
  char local_220 [16];
  Flags local_210;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo
            (&local_448,_lineInfo,(string *)_name,&(_name->super_TestCaseInfo).description);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar2,&local_448);
  sVar3 = (this->m_totals).assertions.passed;
  sVar4 = (this->m_totals).assertions.failed;
  sVar5 = (this->m_totals).assertions.failedButOk;
  this->m_shouldReportUnexpected = true;
  local_3f8._0_8_ = local_3f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"TEST_CASE","");
  local_468._M_string_length = 0;
  local_468.field_2._M_local_buf[0] = '\0';
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_260,(string *)local_3f8,_lineInfo,&local_468,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_260);
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_260._32_8_;
  (this->m_lastAssertionInfo).lineInfo.line = local_260._40_8_;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_230);
  (this->m_lastAssertionInfo).resultDisposition = local_210;
  if (local_230._M_p != local_220) {
    operator_delete(local_230._M_p);
  }
  if ((undefined1 *)CONCAT44(local_260._4_4_,local_260._0_4_) != local_260 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_260._4_4_,local_260._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
    operator_delete((void *)local_3f8._0_8_);
  }
  seedRng((this->m_config).m_p);
  gettimeofday((timeval *)local_260,(__timezone_ptr_t)0x0);
  uVar9 = local_260._8_4_;
  uVar8 = local_260._0_4_;
  uVar10 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar10 & 1) == 0) {
    invokeActiveTestCase(this);
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_260,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect((StreamRedirect *)local_3f8,(ostream *)&std::cerr,redirectedCerr)
    ;
    invokeActiveTestCase(this);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_3f8);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_260);
  }
  gettimeofday((timeval *)local_260,(__timezone_ptr_t)0x0);
  (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[10])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_3f8._0_8_ = (this->m_totals).assertions.passed - sVar3;
  local_3f8._8_8_ = (this->m_totals).assertions.failed - sVar4;
  local_3f8._16_8_ = (this->m_totals).assertions.failedButOk - sVar5;
  _missingAssertions = testForMissingAssertions(this,(Counts *)local_3f8);
  uVar7 = local_3f8._16_8_;
  uVar6 = local_3f8._8_8_;
  if (((_name->super_TestCaseInfo).properties & (MayFail|ShouldFail)) != None) {
    local_3f8._16_8_ = local_3f8._8_8_;
    local_3f8._8_8_ = uVar7;
    psVar1 = &(this->m_totals).assertions.failed;
    *psVar1 = *psVar1 - uVar6;
    psVar1 = &(this->m_totals).assertions.failedButOk;
    *psVar1 = (size_t)(uVar6 + *psVar1);
  }
  SectionStats::SectionStats
            ((SectionStats *)local_260,&local_448,(Counts *)local_3f8,
             (double)(uint)((local_260._8_4_ - uVar9) + (local_260._0_4_ - uVar8) * 1000000) /
             1000000.0,_missingAssertions);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,local_260);
  SectionStats::~SectionStats((SectionStats *)local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.description._M_dataplus._M_p != &local_448.description.field_2) {
    operator_delete(local_448.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.name._M_dataplus._M_p != &local_448.name.field_2) {
    operator_delete(local_448.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            m_shouldReportUnexpected = true;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, std::string(), ResultDisposition::Normal );

                seedRng( *m_config );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( Catch::cout(), redirectedCout );
                    StreamRedirect cerrRedir( Catch::cerr(), redirectedCerr );
                    invokeActiveTestCase();
                }
                else {
                    invokeActiveTestCase();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                // Under CATCH_CONFIG_FAST_COMPILE, unexpected exceptions under REQUIRE assertions
                // are reported without translation at the point of origin.
                if (m_shouldReportUnexpected) {
                    makeUnexpectedResultBuilder().useActiveException();
                }
            }
            m_testCaseTracker->close();
            handleUnfinishedSections();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            if( testCaseInfo.okToFail() ) {
                std::swap( assertions.failedButOk, assertions.failed );
                m_totals.assertions.failed -= assertions.failedButOk;
                m_totals.assertions.failedButOk += assertions.failedButOk;
            }

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }